

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O2

void sylvan_gc_aggressive_resize_CALL(WorkerP *w,Task *__dq_head)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong size;
  
  uVar3 = nodes->max_size;
  if (nodes->table_size < uVar3) {
    size = nodes->table_size * 2;
    if (uVar3 <= size) {
      size = uVar3;
    }
    llmsset_set_size(nodes,size);
  }
  sVar1 = cache_getsize();
  sVar2 = cache_getmaxsize();
  if (sVar1 < sVar2) {
    uVar3 = sVar1 * 2;
    if (sVar2 <= sVar1 * 2) {
      uVar3 = sVar2;
    }
    cache_setsize(uVar3);
    return;
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_aggressive_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t new_size = next_size(nodes_size);
        if (new_size > nodes_max) new_size = nodes_max;
        llmsset_set_size(nodes, new_size);
    }
    size_t cache_size = cache_getsize();
    size_t cache_max = cache_getmaxsize();
    if (cache_size < cache_max) {
        size_t new_size = next_size(cache_size);
        if (new_size > cache_max) new_size = cache_max;
        cache_setsize(new_size);
    }
}